

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagr_fe.h
# Opt level: O3

Matrix<double,__1,__1,_0,__1,__1> * __thiscall
lf::uscalfe::FeLagrangeO2Quad<double>::GradientsReferenceShapeFunctions
          (Matrix<double,__1,__1,_0,__1,__1> *__return_storage_ptr__,FeLagrangeO2Quad<double> *this,
          MatrixXd *refcoords)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  long lVar3;
  Scalar *dataPtr;
  CoeffReturnType piVar4;
  undefined8 uVar5;
  long lVar6;
  _Alloc_hider _Var7;
  double *pdVar8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
  *pCVar9;
  MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
  *pMVar10;
  Index IVar11;
  double *pdVar12;
  byte bVar13;
  Array<double,__1,__1,_0,__1,__1> segment_x1_grad;
  Array<double,__1,__1,_0,__1,__1> segment_x0_grad;
  Array<double,__1,__1,_0,__1,__1> segment_x1_eval;
  Array<double,__1,__1,_0,__1,__1> segment_x0_eval;
  Map<Eigen::Array<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> temp;
  stringstream ss;
  assign_op<double,_double> local_381;
  Matrix<double,__1,__1,_0,__1,__1> *local_380;
  Index local_378;
  string local_370;
  long local_350;
  undefined1 local_320 [56];
  undefined1 local_2e8 [120];
  Array<double,__1,__1,_0,__1,__1> local_270;
  Array<double,__1,__1,_0,__1,__1> local_258;
  Array<double,__1,__1,_0,__1,__1> local_240;
  Array<double,__1,__1,_0,__1,__1> local_228;
  Map<Eigen::Array<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_210;
  undefined1 local_1f0 [24];
  XprTypeNested local_1d8;
  double *local_1b8;
  XprTypeNested local_1a0;
  Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false> local_68;
  
  bVar13 = 0;
  if ((refcoords->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
      != 2) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1f0 + 0x10),"Reference coordinates must be 2-vectors",0x27);
    pdVar12 = (double *)(local_2e8 + 0x10);
    local_2e8._0_8_ = pdVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2e8,"refcoords.rows() == 2","");
    paVar1 = &local_370.field_2;
    local_370._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_370,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lagr_fe.h"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed((string *)local_2e8,&local_370,0x32f,(string *)local_320);
    if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
      operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != paVar1) {
      operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
    }
    if ((double *)local_2e8._0_8_ != pdVar12) {
      operator_delete((void *)local_2e8._0_8_,local_2e8._16_8_ + 1);
    }
    local_2e8._0_8_ = pdVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2e8,"false","");
    local_370._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_370,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lagr_fe.h"
               ,"");
    local_320._0_8_ = local_320 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"");
    base::AssertionFailed((string *)local_2e8,&local_370,0x32f,(string *)local_320);
    std::__cxx11::string::~string((string *)local_320);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)local_2e8);
    abort();
  }
  uVar2 = (refcoords->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
          m_cols;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_data = (double *)0x0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_rows = 0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_cols = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&__return_storage_ptr__->
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,9,
             (ulong)(uint)((int)uVar2 * 2));
  local_380 = __return_storage_ptr__;
  dataPtr = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                       __return_storage_ptr__,0,0);
  Eigen::MapBase<Eigen::Map<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>::
  MapBase((MapBase<Eigen::Map<Eigen::Array<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           *)&local_210,dataPtr,0x12,uVar2 & 0xffffffff);
  Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
            ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_1f0,
             refcoords,0);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_370,
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
              *)local_1f0);
  FeLagrangeO2Segment<double>::EvalReferenceShapeFunctions
            ((Matrix<double,__1,__1,_0,__1,__1> *)local_2e8,
             (FeLagrangeO2Segment<double> *)&krsf_segment_,(MatrixXd *)&local_370);
  local_320._0_8_ = (Matrix<double,__1,__1,_0,__1,__1> *)local_2e8;
  Eigen::PlainObjectBase<Eigen::Array<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Array<double,_1,_1,0,_1,_1>> *)&local_228,
             (DenseBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)local_320
            );
  free((void *)local_2e8._0_8_);
  free(local_370._M_dataplus._M_p);
  Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
            ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_1f0,
             refcoords,1);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_370,
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
              *)local_1f0);
  FeLagrangeO2Segment<double>::EvalReferenceShapeFunctions
            ((Matrix<double,__1,__1,_0,__1,__1> *)local_2e8,
             (FeLagrangeO2Segment<double> *)&krsf_segment_,(MatrixXd *)&local_370);
  local_320._0_8_ = (Matrix<double,__1,__1,_0,__1,__1> *)local_2e8;
  Eigen::PlainObjectBase<Eigen::Array<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Array<double,_1,_1,0,_1,_1>> *)&local_240,
             (DenseBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)local_320
            );
  free((void *)local_2e8._0_8_);
  free(local_370._M_dataplus._M_p);
  Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
            ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_1f0,
             refcoords,0);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_370,
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
              *)local_1f0);
  FeLagrangeO2Segment<double>::GradientsReferenceShapeFunctions
            ((Matrix<double,__1,__1,_0,__1,__1> *)local_2e8,
             (FeLagrangeO2Segment<double> *)&krsf_segment_,(MatrixXd *)&local_370);
  local_320._0_8_ = (Matrix<double,__1,__1,_0,__1,__1> *)local_2e8;
  Eigen::PlainObjectBase<Eigen::Array<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Array<double,_1,_1,0,_1,_1>> *)&local_258,
             (DenseBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)local_320
            );
  free((void *)local_2e8._0_8_);
  free(local_370._M_dataplus._M_p);
  Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
            ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_1f0,
             refcoords,1);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_370,
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
              *)local_1f0);
  FeLagrangeO2Segment<double>::GradientsReferenceShapeFunctions
            ((Matrix<double,__1,__1,_0,__1,__1> *)local_2e8,
             (FeLagrangeO2Segment<double> *)&krsf_segment_,(MatrixXd *)&local_370);
  local_320._0_8_ = (Matrix<double,__1,__1,_0,__1,__1> *)local_2e8;
  Eigen::PlainObjectBase<Eigen::Array<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Array<double,_1,_1,0,_1,_1>> *)&local_270,
             (DenseBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)local_320
            );
  free((void *)local_2e8._0_8_);
  free(local_370._M_dataplus._M_p);
  IVar11 = 0;
  do {
    piVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_9,_2,_0,_9,_2>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,_9,_2,_0,_9,_2>,_0> *)
                        &ksegment_to_quad_mapping_,IVar11,0);
    Eigen::Block<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
              ((Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_320,&local_258,
               (long)*piVar4);
    local_378 = IVar11;
    piVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_9,_2,_0,_9,_2>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,_9,_2,_0,_9,_2>,_0> *)
                        &ksegment_to_quad_mapping_,IVar11,1);
    Eigen::Block<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
              (&local_68,&local_240,(long)*piVar4);
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_const_Eigen::Block<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
    ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                     *)local_2e8,
                    (Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_320,
                    &local_68,(scalar_product_op<double,_double> *)&local_370);
    pCVar9 = (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
              *)local_2e8;
    pMVar10 = (MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
               *)local_1f0;
    for (lVar6 = 0xe; lVar6 != 0; lVar6 = lVar6 + -1) {
      (pMVar10->m_expression).m_lhs.
      super_BlockImpl<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.m_data =
           (pCVar9->m_lhs).
           super_BlockImpl<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
           m_data;
      pCVar9 = (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                *)((long)pCVar9 + (ulong)bVar13 * -0x10 + 8);
      pMVar10 = (MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
                 *)((long)pMVar10 + (ulong)bVar13 * -0x10 + 8);
    }
    Eigen::
    Block<Eigen::Map<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1,_-1,_false>
    ::Block((Block<Eigen::Map<Eigen::Array<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_false>
             *)&local_370,&local_210,local_378);
    pdVar8 = local_1b8;
    pdVar12 = (double *)local_1f0._0_8_;
    lVar6 = (((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
             &local_1d8->super_PlainObjectBase<Eigen::Array<double,__1,__1,_0,__1,__1>_>)->m_storage
            ).m_rows;
    lVar3 = (local_1a0->super_PlainObjectBase<Eigen::Array<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_rows;
    Eigen::internal::
    resize_if_allowed<Eigen::Block<Eigen::Map<Eigen::Array<double,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,1,_1,false>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Array<double,_1,_1,0,_1,_1>,1,_1,false>const,Eigen::Block<Eigen::Array<double,_1,_1,0,_1,_1>,1,_1,false>const>const>,double,double>
              ((Block<Eigen::Map<Eigen::Array<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_false>
                *)&local_370,
               (MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
                *)local_1f0,&local_381);
    IVar11 = local_378;
    uVar5 = local_370.field_2._M_allocated_capacity;
    _Var7._M_p = local_370._M_dataplus._M_p;
    if (0 < (long)local_370.field_2._M_allocated_capacity) {
      do {
        *(double *)_Var7._M_p = *pdVar12 * *pdVar8;
        pdVar8 = pdVar8 + lVar3;
        pdVar12 = pdVar12 + lVar6;
        uVar5 = uVar5 - 1;
        _Var7._M_p = (pointer)((long)_Var7._M_p + local_350 * 8);
      } while (uVar5 != 0);
    }
    piVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_9,_2,_0,_9,_2>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,_9,_2,_0,_9,_2>,_0> *)
                        &ksegment_to_quad_mapping_,local_378,1);
    Eigen::Block<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
              ((Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_320,&local_270,
               (long)*piVar4);
    piVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_9,_2,_0,_9,_2>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,_9,_2,_0,_9,_2>,_0> *)
                        &ksegment_to_quad_mapping_,IVar11,0);
    Eigen::Block<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
              (&local_68,&local_228,(long)*piVar4);
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_const_Eigen::Block<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
    ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                     *)local_2e8,
                    (Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_320,
                    &local_68,(scalar_product_op<double,_double> *)&local_370);
    pCVar9 = (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
              *)local_2e8;
    pMVar10 = (MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
               *)local_1f0;
    for (lVar6 = 0xe; lVar6 != 0; lVar6 = lVar6 + -1) {
      (pMVar10->m_expression).m_lhs.
      super_BlockImpl<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.m_data =
           (pCVar9->m_lhs).
           super_BlockImpl<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
           m_data;
      pCVar9 = (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                *)((long)pCVar9 + (ulong)bVar13 * -0x10 + 8);
      pMVar10 = (MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
                 *)((long)pMVar10 + (ulong)bVar13 * -0x10 + 8);
    }
    Eigen::
    Block<Eigen::Map<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1,_-1,_false>
    ::Block((Block<Eigen::Map<Eigen::Array<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_false>
             *)&local_370,&local_210,local_378 + 9);
    pdVar8 = local_1b8;
    pdVar12 = (double *)local_1f0._0_8_;
    lVar6 = (((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
             &local_1d8->super_PlainObjectBase<Eigen::Array<double,__1,__1,_0,__1,__1>_>)->m_storage
            ).m_rows;
    lVar3 = (local_1a0->super_PlainObjectBase<Eigen::Array<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_rows;
    Eigen::internal::
    resize_if_allowed<Eigen::Block<Eigen::Map<Eigen::Array<double,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,1,_1,false>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Array<double,_1,_1,0,_1,_1>,1,_1,false>const,Eigen::Block<Eigen::Array<double,_1,_1,0,_1,_1>,1,_1,false>const>const>,double,double>
              ((Block<Eigen::Map<Eigen::Array<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_false>
                *)&local_370,
               (MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
                *)local_1f0,&local_381);
    uVar5 = local_370.field_2._M_allocated_capacity;
    _Var7._M_p = local_370._M_dataplus._M_p;
    if (0 < (long)local_370.field_2._M_allocated_capacity) {
      do {
        *(double *)_Var7._M_p = *pdVar12 * *pdVar8;
        pdVar8 = pdVar8 + lVar3;
        pdVar12 = pdVar12 + lVar6;
        uVar5 = uVar5 - 1;
        _Var7._M_p = (pointer)((long)_Var7._M_p + local_350 * 8);
      } while (uVar5 != 0);
    }
    IVar11 = local_378 + 1;
  } while (IVar11 != 9);
  free(local_270.super_PlainObjectBase<Eigen::Array<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(local_258.super_PlainObjectBase<Eigen::Array<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(local_240.super_PlainObjectBase<Eigen::Array<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(local_228.super_PlainObjectBase<Eigen::Array<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  return local_380;
}

Assistant:

[[nodiscard]] Eigen::Matrix<SCALAR, Eigen::Dynamic, Eigen::Dynamic>
  GradientsReferenceShapeFunctions(
      const Eigen::MatrixXd& refcoords) const override {
    LF_ASSERT_MSG(refcoords.rows() == 2,
                  "Reference coordinates must be 2-vectors");

    const size_type n_pts(refcoords.cols());
    Eigen::Matrix<SCALAR, Eigen::Dynamic, Eigen::Dynamic> result(9, 2 * n_pts);

    // reshape into a 18xn_pts matrix.
    Eigen::Map<Eigen::Array<SCALAR, Eigen::Dynamic, Eigen::Dynamic>,
               Eigen::AutoAlign>
        temp(&result(0, 0), 18, n_pts);

    // evaluate "segment" shape functions (b^j and b^l)
    Eigen::Array<SCALAR, Eigen::Dynamic, Eigen::Dynamic> segment_x0_eval =
        (krsf_segment_.EvalReferenceShapeFunctions(refcoords.row(0))).array();
    Eigen::Array<SCALAR, Eigen::Dynamic, Eigen::Dynamic> segment_x1_eval =
        (krsf_segment_.EvalReferenceShapeFunctions(refcoords.row(1))).array();

    // evaluate derivatives of "segment" shape functions (b^j and
    // b^l)
    Eigen::Array<SCALAR, Eigen::Dynamic, Eigen::Dynamic> segment_x0_grad =
        (krsf_segment_.GradientsReferenceShapeFunctions(refcoords.row(0)))
            .array();
    Eigen::Array<SCALAR, Eigen::Dynamic, Eigen::Dynamic> segment_x1_grad =
        (krsf_segment_.GradientsReferenceShapeFunctions(refcoords.row(1)))
            .array();

    // evaluate gradients  using the product rule and
    // the tensor product structure of the basis functions.
    for (int i = 0; i < 9; ++i) {
      // d/dx
      temp.row(i) = (segment_x0_grad.row(ksegment_to_quad_mapping_(i, 0)) *
                     segment_x1_eval.row(ksegment_to_quad_mapping_(i, 1)))
                        .matrix();
      // d/dy
      temp.row(i + 9) = (segment_x1_grad.row(ksegment_to_quad_mapping_(i, 1)) *
                         segment_x0_eval.row(ksegment_to_quad_mapping_(i, 0)))
                            .matrix();
    }
    return result;
  }